

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O0

void Warning(char *message,char *badValueMessage,EWStatus type)

{
  bool bVar1;
  EWStatus type_local;
  char *badValueMessage_local;
  char *message_local;
  
  bVar1 = isInactiveTypeInCurrentPass(type);
  if (!bVar1) {
    WarningImpl((char *)0x0,message,badValueMessage,type);
  }
  return;
}

Assistant:

void Warning(const char* message, const char* badValueMessage, EWStatus type) {
	if (isInactiveTypeInCurrentPass(type)) return;
	WarningImpl(nullptr, message, badValueMessage, type);
}